

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void embree::ISPCScene::updateLight(Ref<embree::SceneGraph::LightNode> *in,Light *out)

{
  long *in_RDI;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>_> light_3;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::DistantLight>_> light_2;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::DirectionalLight>_> light_1;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>_> light;
  Light *in_stack_fffffffffffffdd8;
  PointLight *in_stack_fffffffffffffde0;
  Light *in_stack_fffffffffffffdf0;
  DirectionalLight *in_stack_fffffffffffffdf8;
  Light *in_stack_fffffffffffffe10;
  DistantLight *in_stack_fffffffffffffe18;
  long *local_1c8;
  long *local_1a0;
  long *local_178;
  long *local_150;
  long *local_140;
  long *local_138;
  long *local_130 [3];
  long *local_118 [2];
  long *local_108;
  long **local_f8;
  long **local_f0;
  long **local_e8;
  long *local_e0;
  long **local_d8;
  long **local_d0;
  long **local_c8;
  long *local_c0;
  long **local_b8;
  long **local_b0;
  long **local_a8;
  long *local_a0;
  long **local_98;
  long **local_90;
  long **local_88;
  long **local_80;
  long **local_70;
  long **local_60;
  long **local_50;
  long *local_40;
  long **local_38;
  long *local_30;
  long **local_28;
  long *local_20;
  long **local_18;
  long *local_10;
  long **local_8;
  
  local_f8 = local_118;
  local_108 = in_RDI;
  if (*in_RDI == 0) {
    local_150 = (long *)0x0;
  }
  else {
    local_150 = (long *)__dynamic_cast(*in_RDI,&SceneGraph::LightNode::typeinfo,
                                       &SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>
                                        ::typeinfo,0);
  }
  local_38 = local_118;
  local_40 = local_150;
  local_118[0] = local_150;
  if (local_150 != (long *)0x0) {
    (**(code **)(*local_150 + 0x10))();
  }
  local_f0 = local_118;
  if (local_118[0] == (long *)0x0) {
    local_d8 = local_130;
    local_e0 = local_108;
    if (*local_108 == 0) {
      local_178 = (long *)0x0;
    }
    else {
      local_178 = (long *)__dynamic_cast(*local_108,&SceneGraph::LightNode::typeinfo,
                                         &SceneGraph::
                                          LightNodeImpl<embree::SceneGraph::DirectionalLight>::
                                          typeinfo,0);
    }
    local_28 = local_130;
    local_30 = local_178;
    local_130[0] = local_178;
    if (local_178 != (long *)0x0) {
      (**(code **)(*local_178 + 0x10))();
    }
    local_d0 = local_130;
    if (local_130[0] == (long *)0x0) {
      local_b8 = &local_138;
      local_c0 = local_108;
      if (*local_108 == 0) {
        local_1a0 = (long *)0x0;
      }
      else {
        local_1a0 = (long *)__dynamic_cast(*local_108,&SceneGraph::LightNode::typeinfo,
                                           &SceneGraph::
                                            LightNodeImpl<embree::SceneGraph::DistantLight>::
                                            typeinfo,0);
      }
      local_18 = &local_138;
      local_20 = local_1a0;
      local_138 = local_1a0;
      if (local_1a0 != (long *)0x0) {
        (**(code **)(*local_1a0 + 0x10))();
      }
      local_b0 = &local_138;
      if (local_138 == (long *)0x0) {
        local_98 = &local_140;
        local_a0 = local_108;
        if (*local_108 == 0) {
          local_1c8 = (long *)0x0;
        }
        else {
          local_1c8 = (long *)__dynamic_cast(*local_108,&SceneGraph::LightNode::typeinfo,
                                             &SceneGraph::
                                              LightNodeImpl<embree::SceneGraph::PointLight>::
                                              typeinfo,0);
        }
        local_8 = &local_140;
        local_10 = local_1c8;
        local_140 = local_1c8;
        if (local_1c8 != (long *)0x0) {
          (**(code **)(*local_1c8 + 0x10))();
        }
        local_90 = &local_140;
        if (local_140 != (long *)0x0) {
          local_88 = &local_140;
          updateLight<embree::SceneGraph::PointLight>
                    (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        }
        local_80 = &local_140;
        if (local_140 != (long *)0x0) {
          (**(code **)(*local_140 + 0x18))();
        }
      }
      else {
        local_a8 = &local_138;
        updateLight<embree::SceneGraph::DistantLight>
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      }
      local_70 = &local_138;
      if (local_138 != (long *)0x0) {
        (**(code **)(*local_138 + 0x18))();
      }
    }
    else {
      local_c8 = local_130;
      updateLight<embree::SceneGraph::DirectionalLight>
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    }
    local_60 = local_130;
    if (local_130[0] != (long *)0x0) {
      (**(code **)(*local_130[0] + 0x18))();
    }
  }
  else {
    local_e8 = local_118;
    updateLight<embree::SceneGraph::AmbientLight>
              ((AmbientLight *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  }
  local_50 = local_118;
  if (local_118[0] != (long *)0x0) {
    (**(code **)(*local_118[0] + 0x18))();
  }
  return;
}

Assistant:

void ISPCScene::updateLight(const Ref<SceneGraph::LightNode>& in, Light* out)
  {
    if (auto light = in.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::AmbientLight>>())
      updateLight(light->light, out);
    else if (auto light = in.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::DirectionalLight>>())
      updateLight(light->light, out);
    else if (auto light = in.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::DistantLight>>())
      updateLight(light->light, out);
    else if (auto light = in.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::PointLight>>())
      updateLight(light->light, out);
  }